

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

int fsg_model_word_add(fsg_model_t *fsg,char *word)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  bitvec_t *pbVar4;
  char *pcVar5;
  size_t old_len;
  
  iVar2 = fsg_model_word_id(fsg,word);
  if (iVar2 == -1) {
    iVar2 = fsg->n_word;
    iVar1 = fsg->n_word_alloc;
    old_len = (size_t)iVar1;
    if (iVar2 == iVar1) {
      fsg->n_word_alloc = iVar1 + 10;
      ppcVar3 = (char **)__ckd_realloc__(fsg->vocab,old_len * 8 + 0x50,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                         ,0x17e);
      fsg->vocab = ppcVar3;
      if (fsg->silwords != (bitvec_t *)0x0) {
        pbVar4 = bitvec_realloc(fsg->silwords,old_len,(long)fsg->n_word_alloc);
        fsg->silwords = pbVar4;
      }
      if (fsg->altwords != (bitvec_t *)0x0) {
        pbVar4 = bitvec_realloc(fsg->altwords,old_len,(long)fsg->n_word_alloc);
        fsg->altwords = pbVar4;
      }
    }
    fsg->n_word = fsg->n_word + 1;
    pcVar5 = __ckd_salloc__(word,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x189);
    fsg->vocab[iVar2] = pcVar5;
  }
  return iVar2;
}

Assistant:

int
fsg_model_word_add(fsg_model_t * fsg, char const *word)
{
    int wid, old_size;

    /* Search for an existing word matching this. */
    wid = fsg_model_word_id(fsg, word);
    /* If not found, add this to the vocab. */
    if (wid == -1) {
        wid = fsg->n_word;
        if (fsg->n_word == fsg->n_word_alloc) {
            old_size = fsg->n_word_alloc;
            fsg->n_word_alloc += 10;
            fsg->vocab = ckd_realloc(fsg->vocab,
                                     fsg->n_word_alloc *
                                     sizeof(*fsg->vocab));
            if (fsg->silwords)
                fsg->silwords =
                    bitvec_realloc(fsg->silwords, old_size,
                                   fsg->n_word_alloc);
            if (fsg->altwords)
                fsg->altwords =
                    bitvec_realloc(fsg->altwords, old_size,
                                   fsg->n_word_alloc);
        }
        ++fsg->n_word;
        fsg->vocab[wid] = ckd_salloc(word);
    }
    return wid;
}